

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_protocol.cpp
# Opt level: O2

int PackUserCmd(usercmd_t *ucmd,usercmd_t *basis,BYTE **stream)

{
  short sVar1;
  uint uVar2;
  byte *pbVar3;
  byte bVar4;
  byte *pbVar5;
  byte bVar6;
  uint uVar7;
  short *psVar8;
  short *psVar9;
  short *psVar10;
  short *psVar11;
  byte bVar12;
  short *psVar13;
  byte bVar14;
  short *psVar15;
  short local_44 [2];
  short local_40 [2];
  short local_3c [6];
  
  pbVar3 = *stream;
  if (basis == (usercmd_t *)0x0) {
    basis = (usercmd_t *)(local_3c + 4);
    local_3c[4] = 0;
    local_3c[5] = 0;
    psVar15 = local_3c;
    local_3c[0] = 0;
    psVar11 = local_3c + 3;
    local_3c[3] = 0;
    psVar13 = local_40;
    local_40[0] = 0;
    psVar10 = local_3c + 2;
    local_3c[2] = 0;
    psVar9 = local_44;
    local_44[0] = 0;
    psVar8 = local_3c + 1;
    local_3c[1] = 0;
  }
  else {
    psVar15 = &basis->pitch;
    psVar11 = &basis->yaw;
    psVar10 = &basis->forwardmove;
    psVar9 = &basis->sidemove;
    psVar8 = &basis->upmove;
    psVar13 = &basis->roll;
  }
  *pbVar3 = 0;
  pbVar5 = *stream + 1;
  *stream = pbVar5;
  uVar2 = ucmd->buttons;
  if (uVar2 == basis->buttons) {
    bVar6 = 0;
  }
  else {
    uVar7 = basis->buttons ^ uVar2;
    bVar6 = (byte)(uVar2 >> 7);
    bVar12 = bVar6 & 0x7f;
    bVar4 = (byte)(uVar2 >> 0xe) & 0x7f;
    if (uVar7 < 0x80) {
      bVar14 = (byte)uVar2 & 0x7f;
    }
    else {
      bVar14 = (byte)uVar2 | 0x80;
      if (0x3fff < uVar7) {
        bVar12 = bVar6 | 0x80;
        bVar4 = (0x1fffff < uVar7) << 7 | bVar4;
      }
    }
    *pbVar5 = bVar14;
    pbVar5 = *stream + 1;
    *stream = pbVar5;
    bVar6 = 1;
    if ((char)bVar14 < '\0') {
      *pbVar5 = bVar12;
      pbVar5 = *stream + 1;
      *stream = pbVar5;
      if ((char)bVar12 < '\0') {
        *pbVar5 = bVar4;
        pbVar5 = *stream + 1;
        *stream = pbVar5;
        if ((char)bVar4 < '\0') {
          *pbVar5 = (byte)(uVar2 >> 0x15);
          pbVar5 = *stream + 1;
          *stream = pbVar5;
        }
      }
    }
  }
  sVar1 = ucmd->pitch;
  if (sVar1 != *psVar15) {
    bVar6 = bVar6 | 2;
    *pbVar5 = (byte)((ushort)sVar1 >> 8);
    (*stream)[1] = (BYTE)sVar1;
    pbVar5 = *stream + 2;
    *stream = pbVar5;
  }
  sVar1 = ucmd->yaw;
  if (sVar1 != *psVar11) {
    bVar6 = bVar6 | 4;
    *pbVar5 = (byte)((ushort)sVar1 >> 8);
    (*stream)[1] = (BYTE)sVar1;
    pbVar5 = *stream + 2;
    *stream = pbVar5;
  }
  sVar1 = ucmd->forwardmove;
  if (sVar1 != *psVar10) {
    bVar6 = bVar6 | 8;
    *pbVar5 = (byte)((ushort)sVar1 >> 8);
    (*stream)[1] = (BYTE)sVar1;
    pbVar5 = *stream + 2;
    *stream = pbVar5;
  }
  sVar1 = ucmd->sidemove;
  if (sVar1 != *psVar9) {
    bVar6 = bVar6 | 0x10;
    *pbVar5 = (byte)((ushort)sVar1 >> 8);
    (*stream)[1] = (BYTE)sVar1;
    pbVar5 = *stream + 2;
    *stream = pbVar5;
  }
  sVar1 = ucmd->upmove;
  if (sVar1 != *psVar8) {
    bVar6 = bVar6 | 0x20;
    *pbVar5 = (byte)((ushort)sVar1 >> 8);
    (*stream)[1] = (BYTE)sVar1;
    pbVar5 = *stream + 2;
    *stream = pbVar5;
  }
  sVar1 = ucmd->roll;
  if (sVar1 != *psVar13) {
    bVar6 = bVar6 | 0x40;
    *pbVar5 = (byte)((ushort)sVar1 >> 8);
    (*stream)[1] = (BYTE)sVar1;
    *stream = *stream + 2;
  }
  *pbVar3 = bVar6;
  return *(int *)stream - (int)pbVar3;
}

Assistant:

int PackUserCmd (const usercmd_t *ucmd, const usercmd_t *basis, BYTE **stream)
{
	BYTE flags = 0;
	BYTE *temp = *stream;
	BYTE *start = *stream;
	usercmd_t blank;
	DWORD buttons_changed;

	if (basis == NULL)
	{
		memset (&blank, 0, sizeof(blank));
		basis = &blank;
	}

	WriteByte (0, stream);			// Make room for the packing bits

	buttons_changed = ucmd->buttons ^ basis->buttons;
	if (buttons_changed != 0)
	{
		BYTE bytes[4] = {  BYTE(ucmd->buttons        & 0x7F),
						  BYTE((ucmd->buttons >> 7)  & 0x7F),
						  BYTE((ucmd->buttons >> 14) & 0x7F),
						  BYTE((ucmd->buttons >> 21) & 0xFF) };

		flags |= UCMDF_BUTTONS;

		if (buttons_changed & 0xFFFFFF80)
		{
			bytes[0] |= 0x80;
			if (buttons_changed & 0xFFFFC000)
			{
				bytes[1] |= 0x80;
				if (buttons_changed & 0xFFE00000)
				{
					bytes[2] |= 0x80;
				}
			}
		}
		WriteByte (bytes[0], stream);
		if (bytes[0] & 0x80)
		{
			WriteByte (bytes[1], stream);
			if (bytes[1] & 0x80)
			{
				WriteByte (bytes[2], stream);
				if (bytes[2] & 0x80)
				{
					WriteByte (bytes[3], stream);
				}
			}
		}
	}
	if (ucmd->pitch != basis->pitch)
	{
		flags |= UCMDF_PITCH;
		WriteWord (ucmd->pitch, stream);
	}
	if (ucmd->yaw != basis->yaw)
	{
		flags |= UCMDF_YAW;
		WriteWord (ucmd->yaw, stream);
	}
	if (ucmd->forwardmove != basis->forwardmove)
	{
		flags |= UCMDF_FORWARDMOVE;
		WriteWord (ucmd->forwardmove, stream);
	}
	if (ucmd->sidemove != basis->sidemove)
	{
		flags |= UCMDF_SIDEMOVE;
		WriteWord (ucmd->sidemove, stream);
	}
	if (ucmd->upmove != basis->upmove)
	{
		flags |= UCMDF_UPMOVE;
		WriteWord (ucmd->upmove, stream);
	}
	if (ucmd->roll != basis->roll)
	{
		flags |= UCMDF_ROLL;
		WriteWord (ucmd->roll, stream);
	}

	// Write the packing bits
	WriteByte (flags, &temp);

	return int(*stream - start);
}